

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::PartialBlockManager::PartialBlockManager
          (PartialBlockManager *this,BlockManager *block_manager,PartialBlockType partial_block_type
          ,optional_idx max_partial_block_size_p,uint32_t max_use_count)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  uint uVar3;
  idx_t iVar4;
  idx_t iVar5;
  optional_idx local_20;
  
  this->_vptr_PartialBlockManager = (_func_int **)&PTR__PartialBlockManager_01979618;
  this->block_manager = block_manager;
  this->partial_block_type = partial_block_type;
  (this->partial_block_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->partial_block_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->partial_block_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->partial_block_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->partial_block_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
  (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->max_use_count = max_use_count;
  local_20.index = max_partial_block_size_p.index;
  if (max_partial_block_size_p.index == 0xffffffffffffffff) {
    iVar4 = optional_idx::GetIndex(&block_manager->block_alloc_size);
    iVar5 = optional_idx::GetIndex(&block_manager->block_header_size);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = iVar4 - iVar5;
    iVar4 = SUB168(auVar2 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc;
  }
  else {
    iVar4 = optional_idx::GetIndex(&local_20);
  }
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(iVar4);
  this->max_partial_block_size = uVar3;
  return;
}

Assistant:

PartialBlockManager::PartialBlockManager(BlockManager &block_manager, PartialBlockType partial_block_type,
                                         optional_idx max_partial_block_size_p, uint32_t max_use_count)
    : block_manager(block_manager), partial_block_type(partial_block_type), max_use_count(max_use_count) {

	if (max_partial_block_size_p.IsValid()) {
		max_partial_block_size = NumericCast<uint32_t>(max_partial_block_size_p.GetIndex());
		return;
	}

	// Use the default maximum partial block size with a ratio of 20% free and 80% utilization.
	max_partial_block_size = NumericCast<uint32_t>(block_manager.GetBlockSize() / 5 * 4);
}